

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

bool_t xdr_uint32_t(XDR *__xdrs,uint32_t *__up)

{
  uint *puVar1;
  uint uVar2;
  xdr_op xVar3;
  _Bool _Var4;
  bool_t bVar5;
  undefined7 extraout_var;
  
  xVar3 = __xdrs[2].x_op;
  if (xVar3 == XDR_FREE) {
    return 1;
  }
  if (xVar3 != XDR_DECODE) {
    if (xVar3 == XDR_ENCODE) {
      _Var4 = xdr_putuint32((XDR *)__xdrs,*__up);
      return (bool_t)CONCAT71(extraout_var,_Var4);
    }
    return 0;
  }
  puVar1 = *(uint **)&__xdrs->x_handy + 1;
  if (__xdrs[1].x_private < puVar1) {
    bVar5 = (*(code *)**(undefined8 **)__xdrs)();
    return bVar5;
  }
  uVar2 = **(uint **)&__xdrs->x_handy;
  *__up = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  *(uint **)&__xdrs->x_handy = puVar1;
  return (bool_t)CONCAT71((int7)((ulong)puVar1 >> 8),1);
}

Assistant:

static inline bool
xdr_uint32_t(XDR *xdrs, uint32_t *u_int32_p)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (XDR_PUTUINT32(xdrs, *u_int32_p));

	case XDR_DECODE:
		return (XDR_GETUINT32(xdrs, u_int32_p));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}